

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O3

void __thiscall Omega_h::Read<long>::Read(Read<long> *this,initializer_list<long> l,string *name_in)

{
  int *piVar1;
  int iVar2;
  void *__buf;
  HostWrite<long> local_30;
  HostWrite<long> local_20;
  
  HostWrite<long>::HostWrite(&local_20,l,name_in);
  HostWrite<long>::write(&local_30,(int)&local_20,__buf,(size_t)name_in);
  (this->write_).shared_alloc_.alloc = local_30.write_.shared_alloc_.alloc;
  if (((ulong)local_30.write_.shared_alloc_.alloc & 7) == 0 &&
      local_30.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->write_).shared_alloc_.alloc =
           (Alloc *)((local_30.write_.shared_alloc_.alloc)->size * 8 + 1);
      iVar2 = (local_30.write_.shared_alloc_.alloc)->use_count + -1;
    }
    else {
      iVar2 = (local_30.write_.shared_alloc_.alloc)->use_count;
      (local_30.write_.shared_alloc_.alloc)->use_count = iVar2 + 1;
    }
    (this->write_).shared_alloc_.direct_ptr = local_30.write_.shared_alloc_.direct_ptr;
    (local_30.write_.shared_alloc_.alloc)->use_count = iVar2;
    if (iVar2 == 0) {
      Alloc::~Alloc(local_30.write_.shared_alloc_.alloc);
      operator_delete(local_30.write_.shared_alloc_.alloc,0x48);
    }
  }
  else {
    (this->write_).shared_alloc_.direct_ptr = local_30.write_.shared_alloc_.direct_ptr;
  }
  if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
      local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_20.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_20.write_.shared_alloc_.alloc);
      operator_delete(local_20.write_.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

Read<T>::Read(std::initializer_list<T> l, std::string const& name_in)
    : Read<T>(HostWrite<T>(l, name_in).write()) {}